

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

String * __thiscall
Json::Value::toStyledString_abi_cxx11_(String *__return_storage_ptr__,Value *this)

{
  bool bVar1;
  char *__s;
  Value *root;
  String local_80;
  allocator<char> local_5d [20];
  undefined1 local_49;
  undefined1 local_48 [8];
  StreamWriterBuilder builder;
  Value *this_local;
  String *out;
  
  builder.settings_.limit_ = (ptrdiff_t)this;
  StreamWriterBuilder::StreamWriterBuilder((StreamWriterBuilder *)local_48);
  local_49 = 0;
  bVar1 = hasComment(this,commentBefore);
  root = (Value *)0xd5f811;
  __s = "";
  if (bVar1) {
    __s = "\n";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,local_5d);
  std::allocator<char>::~allocator(local_5d);
  writeString_abi_cxx11_(&local_80,(Json *)local_48,(Factory *)this,root);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
  local_49 = 1;
  StreamWriterBuilder::~StreamWriterBuilder((StreamWriterBuilder *)local_48);
  return __return_storage_ptr__;
}

Assistant:

String Value::toStyledString() const {
  StreamWriterBuilder builder;

  String out = this->hasComment(commentBefore) ? "\n" : "";
  out += Json::writeString(builder, *this);
  out += '\n';

  return out;
}